

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

bool fmt::v8::detail::check_char_specs<char,fmt::v8::detail::error_handler>
               (basic_format_specs<char> *specs,error_handler *eh)

{
  presentation_type pVar1;
  bool bVar2;
  
  pVar1 = specs->type;
  if (pVar1 - 1 < 6) {
    bVar2 = false;
  }
  else {
    if ((pVar1 != none) && (pVar1 != chr)) {
      throw_format_error("invalid type specifier");
    }
    if (((*(ushort *)&specs->field_0x9 & 0xf) == 4) ||
       (bVar2 = true, (*(ushort *)&specs->field_0x9 & 0xf0) != 0)) {
      throw_format_error("invalid format specifier for char");
    }
  }
  return bVar2;
}

Assistant:

FMT_CONSTEXPR auto check_char_specs(const basic_format_specs<Char>& specs,
                                    ErrorHandler&& eh = {}) -> bool {
  if (specs.type != presentation_type::none &&
      specs.type != presentation_type::chr) {
    check_int_type_spec(specs.type, eh);
    return false;
  }
  if (specs.align == align::numeric || specs.sign != sign::none || specs.alt)
    eh.on_error("invalid format specifier for char");
  return true;
}